

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O0

void google::protobuf::util::anon_unknown_1::ConvertEnumDescriptor
               (EnumDescriptor *descriptor,Enum *enum_type)

{
  Enum *pEVar1;
  Edition edition;
  Syntax value_00;
  int iVar2;
  FileDescriptor *pFVar3;
  DescriptorStringView psVar4;
  Arena *pAVar5;
  SourceContext *this;
  EnumDescriptor *value_01;
  EnumValueDescriptor *this_00;
  RepeatedPtrField<google::protobuf::EnumValue> *this_01;
  pointer this_02;
  EnumValueOptions *options;
  RepeatedPtrField<google::protobuf::Option> *pRVar6;
  EnumOptions *options_00;
  EnumValue *value;
  EnumValueDescriptor *value_descriptor;
  int i;
  Enum *local_60;
  Enum *enum_type_local;
  EnumDescriptor *descriptor_local;
  SourceContext *local_48;
  anon_union_16_1_493b367e_for_SourceContext_4 *local_40;
  DescriptorStringView local_38;
  Enum *local_30;
  anon_union_88_1_493b367e_for_Enum_4 *local_28;
  DescriptorStringView local_20;
  pointer local_18;
  anon_union_40_1_493b367e_for_EnumValue_4 *local_10;
  
  local_60 = enum_type;
  enum_type_local = (Enum *)descriptor;
  Enum::Clear(enum_type);
  pEVar1 = local_60;
  pFVar3 = EnumDescriptor::file((EnumDescriptor *)enum_type_local);
  FileDescriptorLegacy::FileDescriptorLegacy
            ((FileDescriptorLegacy *)&stack0xffffffffffffff98,pFVar3);
  edition = FileDescriptorLegacy::edition((FileDescriptorLegacy *)&stack0xffffffffffffff98);
  value_00 = ConvertSyntax(edition);
  Enum::set_syntax(pEVar1,value_00);
  pEVar1 = local_60;
  psVar4 = EnumDescriptor::full_name_abi_cxx11_((EnumDescriptor *)enum_type_local);
  local_30 = pEVar1;
  local_28 = &pEVar1->field_0;
  local_38 = psVar4;
  pAVar5 = MessageLite::GetArena((MessageLite *)pEVar1);
  internal::ArenaStringPtr::Set<>(&(pEVar1->field_0)._impl_.name_,psVar4,pAVar5);
  this = Enum::mutable_source_context(local_60);
  pFVar3 = EnumDescriptor::file((EnumDescriptor *)enum_type_local);
  value_01 = (EnumDescriptor *)FileDescriptor::name_abi_cxx11_(pFVar3);
  local_40 = &this->field_0;
  descriptor_local = value_01;
  local_48 = this;
  pAVar5 = MessageLite::GetArena((MessageLite *)this);
  internal::ArenaStringPtr::Set<>(&(this->field_0)._impl_.file_name_,(string *)value_01,pAVar5);
  value_descriptor._4_4_ = 0;
  while( true ) {
    iVar2 = EnumDescriptor::value_count((EnumDescriptor *)enum_type_local);
    if (iVar2 <= value_descriptor._4_4_) break;
    this_00 = EnumDescriptor::value((EnumDescriptor *)enum_type_local,value_descriptor._4_4_);
    this_01 = Enum::mutable_enumvalue(local_60);
    this_02 = RepeatedPtrField<google::protobuf::EnumValue>::Add(this_01);
    psVar4 = EnumValueDescriptor::name_abi_cxx11_(this_00);
    local_10 = &this_02->field_0;
    local_20 = psVar4;
    local_18 = this_02;
    pAVar5 = MessageLite::GetArena((MessageLite *)this_02);
    internal::ArenaStringPtr::Set<>(&(this_02->field_0)._impl_.name_,psVar4,pAVar5);
    iVar2 = EnumValueDescriptor::number(this_00);
    EnumValue::set_number(this_02,iVar2);
    options = EnumValueDescriptor::options(this_00);
    pRVar6 = EnumValue::mutable_options(this_02);
    ConvertEnumValueOptions(options,pRVar6);
    value_descriptor._4_4_ = value_descriptor._4_4_ + 1;
  }
  options_00 = EnumDescriptor::options((EnumDescriptor *)enum_type_local);
  pRVar6 = Enum::mutable_options(local_60);
  ConvertEnumOptions(options_00,pRVar6);
  return;
}

Assistant:

void ConvertEnumDescriptor(const EnumDescriptor& descriptor, Enum* enum_type) {
  enum_type->Clear();
  enum_type->set_syntax(
      ConvertSyntax(FileDescriptorLegacy(descriptor.file()).edition()));

  enum_type->set_name(descriptor.full_name());
  enum_type->mutable_source_context()->set_file_name(descriptor.file()->name());
  for (int i = 0; i < descriptor.value_count(); ++i) {
    const EnumValueDescriptor& value_descriptor = *descriptor.value(i);
    EnumValue* value = enum_type->mutable_enumvalue()->Add();
    value->set_name(value_descriptor.name());
    value->set_number(value_descriptor.number());

    ConvertEnumValueOptions(value_descriptor.options(),
                            *value->mutable_options());
  }

  ConvertEnumOptions(descriptor.options(), *enum_type->mutable_options());
}